

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase389::TestCase389(TestCase389 *this)

{
  TestCase389 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x185,"legacy test: Common/Defer");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_002b81f0;
  return;
}

Assistant:

TEST(Common, Defer) {
  uint i = 0;
  uint j = 1;
  bool k = false;

  {
    KJ_DEFER(++i);
    KJ_DEFER(j += 3; k = true);
    EXPECT_EQ(0u, i);
    EXPECT_EQ(1u, j);
    EXPECT_FALSE(k);
  }

  EXPECT_EQ(1u, i);
  EXPECT_EQ(4u, j);
  EXPECT_TRUE(k);
}